

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O3

reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
__thiscall
Gudhi::ripser::
Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>
::
get_simplex_vertices<std::reverse_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>
          (Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>
           *this,simplex_t idx,dimension_t dim,vertex_t n,
          reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
          *out)

{
  long lVar1;
  byte bVar2;
  undefined1 idx_00 [16];
  vertex_t vVar3;
  byte bVar4;
  uint uVar5;
  undefined4 in_register_00000014;
  long lVar6;
  uint uVar7;
  undefined8 unaff_RBX;
  undefined7 in_register_00000031;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  char in_R8B;
  Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_> *this_00;
  ulong uVar11;
  bool bVar12;
  
  uVar11 = CONCAT44(in_register_00000014,n);
  if ((char)(in_R8B + 1U) < '\x02') {
    lVar6 = *(long *)idx;
  }
  else {
    this_00 = (Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_> *)
              (CONCAT71(in_register_00000031,dim) + 0x30);
    uVar7 = (uint)(byte)(in_R8B + 1U);
    do {
      idx_00._8_8_ = unaff_RBX;
      idx_00._0_8_ = this;
      vVar3 = Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::
              get_max_vertex(this_00,(simplex_t)idx_00,(dimension_t)uVar11,(vertex_t)out);
      lVar1 = *(long *)idx;
      lVar6 = lVar1 + -4;
      *(long *)idx = lVar6;
      *(vertex_t *)(lVar1 + -4) = vVar3;
      uVar8 = (ulong)vVar3;
      uVar5 = this_00->bits_per_vertex * (uVar7 - 1);
      bVar4 = (byte)uVar5;
      bVar2 = bVar4 & 0x3f;
      uVar9 = uVar8 << (bVar4 & 0x3f);
      uVar10 = uVar9;
      uVar8 = ((long)uVar8 >> 0x3f) << bVar2 | uVar8 >> 0x40 - bVar2;
      if ((uVar5 & 0x40) != 0) {
        uVar10 = 0;
        uVar8 = uVar9;
      }
      bVar12 = uVar11 < uVar10;
      uVar11 = uVar11 - uVar10;
      out = (reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
             *)((long)out + (-(ulong)bVar12 - uVar8));
      bVar12 = 2 < uVar7;
      uVar7 = uVar7 - 1;
    } while (bVar12);
  }
  *(int *)(lVar6 + -4) = (int)uVar11;
  *(long *)this = lVar6;
  return (reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
          )(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)this;
}

Assistant:

OutputIterator get_simplex_vertices(simplex_t idx, const dimension_t dim, vertex_t n,
        OutputIterator out) const {
      --n;
      for (dimension_t k = dim + 1; k > 1; --k) {
        n = simplex_encoding.get_max_vertex(idx, k, n);
        *out++ = n;
        idx -= simplex_encoding(n, k);
      }
      *out = static_cast<vertex_t>(idx);
      return out;
    }